

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O0

bool S2ShapeIndex::IteratorBase::LocateImpl<S2ShapeIndex::Iterator>
               (S2Point *target_point,Iterator *it)

{
  bool bVar1;
  bool local_62;
  bool local_61;
  S2CellId local_58;
  uint64 local_50;
  uint64 local_48;
  S2CellId local_40;
  uint64 local_38;
  uint64 local_30;
  S2CellId local_28;
  S2CellId target;
  Iterator *it_local;
  S2Point *target_point_local;
  
  target.id_ = (uint64)it;
  S2CellId::S2CellId(&local_28,target_point);
  local_30 = local_28.id_;
  S2ShapeIndex::Iterator::Seek((Iterator *)target.id_,local_28);
  bVar1 = S2ShapeIndex::Iterator::done((Iterator *)target.id_);
  local_61 = false;
  if (!bVar1) {
    local_40 = S2ShapeIndex::Iterator::id(target.id_);
    local_38 = (uint64)S2CellId::range_min(&local_40);
    local_48 = local_28.id_;
    local_61 = operator<=((S2CellId)local_38,local_28);
  }
  if (local_61 == false) {
    bVar1 = S2ShapeIndex::Iterator::Prev((Iterator *)target.id_);
    local_62 = false;
    if (bVar1) {
      local_58 = S2ShapeIndex::Iterator::id(target.id_);
      local_50 = (uint64)S2CellId::range_max(&local_58);
      local_62 = operator>=((S2CellId)local_50,local_28);
    }
    if (local_62 == false) {
      target_point_local._7_1_ = false;
    }
    else {
      target_point_local._7_1_ = true;
    }
  }
  else {
    target_point_local._7_1_ = true;
  }
  return target_point_local._7_1_;
}

Assistant:

inline bool S2ShapeIndex::IteratorBase::LocateImpl(
    const S2Point& target_point, Iter* it) {
  // Let I = cell_map_->lower_bound(T), where T is the leaf cell containing
  // "target_point".  Then if T is contained by an index cell, then the
  // containing cell is either I or I'.  We test for containment by comparing
  // the ranges of leaf cells spanned by T, I, and I'.

  S2CellId target(target_point);
  it->Seek(target);
  if (!it->done() && it->id().range_min() <= target) return true;
  if (it->Prev() && it->id().range_max() >= target) return true;
  return false;
}